

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

IT_PLAYING * dup_playing(IT_PLAYING *src,IT_CHANNEL *dstchannel,IT_CHANNEL *srcchannel)

{
  IT_INSTRUMENT *pIVar1;
  undefined8 uVar2;
  IT_FILTER_STATE IVar3;
  int iVar4;
  char cVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  IT_PLAYING *__ptr;
  void *pvVar20;
  long lVar21;
  DUMB_RESAMPLER *pDVar22;
  DUMB_RESAMPLER *pDVar23;
  byte bVar24;
  
  bVar24 = 0;
  if ((src != (IT_PLAYING *)0x0) &&
     (__ptr = (IT_PLAYING *)malloc(0x128), __ptr != (IT_PLAYING *)0x0)) {
    iVar4 = src->resampling_quality;
    __ptr->flags = src->flags;
    __ptr->resampling_quality = iVar4;
    __ptr->channel = (IT_CHANNEL *)((long)dstchannel + ((long)src->channel - (long)srcchannel));
    pIVar1 = src->instrument;
    __ptr->sample = src->sample;
    __ptr->instrument = pIVar1;
    __ptr->env_instrument = src->env_instrument;
    __ptr->sampnum = src->sampnum;
    __ptr->instnum = src->instnum;
    __ptr->declick_stage = src->declick_stage;
    uVar2 = *(undefined8 *)src->ramp_volume;
    *(undefined8 *)__ptr->float_volume = *(undefined8 *)src->float_volume;
    *(undefined8 *)__ptr->ramp_volume = uVar2;
    *(undefined8 *)__ptr->ramp_delta = *(undefined8 *)src->ramp_delta;
    __ptr->channel_volume = src->channel_volume;
    __ptr->volume = src->volume;
    __ptr->pan = src->pan;
    cVar5 = src->panning_offset;
    uVar6 = src->note;
    uVar7 = src->enabled_envelopes;
    __ptr->volume_offset = src->volume_offset;
    __ptr->panning_offset = cVar5;
    __ptr->note = uVar6;
    __ptr->enabled_envelopes = uVar7;
    __ptr->filter_cutoff = src->filter_cutoff;
    __ptr->filter_resonance = src->filter_resonance;
    __ptr->true_filter_cutoff = src->true_filter_cutoff;
    uVar6 = src->vibrato_speed;
    uVar7 = src->vibrato_depth;
    uVar8 = src->vibrato_n;
    uVar9 = src->vibrato_time;
    uVar10 = src->vibrato_waveform;
    uVar11 = src->tremolo_speed;
    uVar12 = src->tremolo_depth;
    uVar13 = src->tremolo_time;
    uVar14 = src->tremolo_waveform;
    uVar15 = src->panbrello_speed;
    uVar16 = src->panbrello_depth;
    uVar17 = src->panbrello_time;
    uVar18 = src->panbrello_waveform;
    cVar5 = src->panbrello_random;
    uVar19 = src->sample_vibrato_time;
    __ptr->true_filter_resonance = src->true_filter_resonance;
    __ptr->vibrato_speed = uVar6;
    __ptr->vibrato_depth = uVar7;
    __ptr->vibrato_n = uVar8;
    __ptr->vibrato_time = uVar9;
    __ptr->vibrato_waveform = uVar10;
    __ptr->tremolo_speed = uVar11;
    __ptr->tremolo_depth = uVar12;
    __ptr->tremolo_time = uVar13;
    __ptr->tremolo_waveform = uVar14;
    __ptr->panbrello_speed = uVar15;
    __ptr->panbrello_depth = uVar16;
    __ptr->panbrello_time = uVar17;
    __ptr->panbrello_waveform = uVar18;
    __ptr->panbrello_random = cVar5;
    __ptr->sample_vibrato_time = uVar19;
    __ptr->sample_vibrato_waveform = src->sample_vibrato_waveform;
    iVar4 = src->slide;
    __ptr->sample_vibrato_depth = src->sample_vibrato_depth;
    __ptr->slide = iVar4;
    __ptr->delta = src->delta;
    __ptr->finetune = src->finetune;
    (__ptr->volume_envelope).value = (src->volume_envelope).value;
    iVar4 = (src->volume_envelope).tick;
    (__ptr->volume_envelope).next_node = (src->volume_envelope).next_node;
    (__ptr->volume_envelope).tick = iVar4;
    (__ptr->pan_envelope).value = (src->pan_envelope).value;
    iVar4 = (src->pan_envelope).tick;
    (__ptr->pan_envelope).next_node = (src->pan_envelope).next_node;
    (__ptr->pan_envelope).tick = iVar4;
    iVar4 = (src->pitch_envelope).tick;
    (__ptr->pitch_envelope).next_node = (src->pitch_envelope).next_node;
    (__ptr->pitch_envelope).tick = iVar4;
    (__ptr->pitch_envelope).value = (src->pitch_envelope).value;
    __ptr->fadeoutcount = src->fadeoutcount;
    IVar3 = src->filter_state[1];
    __ptr->filter_state[0] = src->filter_state[0];
    __ptr->filter_state[1] = IVar3;
    pDVar22 = &src->resampler;
    pDVar23 = &__ptr->resampler;
    for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
      pDVar23->src = pDVar22->src;
      pDVar22 = (DUMB_RESAMPLER *)((long)pDVar22 + (ulong)bVar24 * -0x10 + 8);
      pDVar23 = (DUMB_RESAMPLER *)((long)pDVar23 + (ulong)bVar24 * -0x10 + 8);
    }
    (__ptr->resampler).pickup_data = __ptr;
    (__ptr->resampler).fir_resampler_ratio = (src->resampler).fir_resampler_ratio;
    pvVar20 = resampler_dup((src->resampler).fir_resampler[0]);
    (__ptr->resampler).fir_resampler[0] = pvVar20;
    if (pvVar20 != (void *)0x0) {
      pvVar20 = resampler_dup((src->resampler).fir_resampler[1]);
      (__ptr->resampler).fir_resampler[1] = pvVar20;
      if (pvVar20 != (void *)0x0) {
        __ptr->time_lost = src->time_lost;
        return __ptr;
      }
      resampler_delete((__ptr->resampler).fir_resampler[0]);
    }
    free(__ptr);
  }
  return (IT_PLAYING *)0x0;
}

Assistant:

static IT_PLAYING *dup_playing(IT_PLAYING *src, IT_CHANNEL *dstchannel, IT_CHANNEL *srcchannel)
{
	IT_PLAYING *dst;

	if (!src) return NULL;

	dst = malloc(sizeof(*dst));
	if (!dst) return NULL;

	dst->flags = src->flags;
	dst->resampling_quality = src->resampling_quality;

	ASSERT(src->channel);
	dst->channel = &dstchannel[src->channel - srcchannel];
	dst->sample = src->sample;
	dst->instrument = src->instrument;
	dst->env_instrument = src->env_instrument;

	dst->sampnum = src->sampnum;
	dst->instnum = src->instnum;

	dst->declick_stage = src->declick_stage;

	dst->float_volume[0] = src->float_volume[0];
	dst->float_volume[1] = src->float_volume[1];

	dst->ramp_volume[0] = src->ramp_volume[0];
	dst->ramp_volume[1] = src->ramp_volume[1];

	dst->ramp_delta[0] = src->ramp_delta[0];
	dst->ramp_delta[1] = src->ramp_delta[1];

	dst->channel_volume = src->channel_volume;

	dst->volume = src->volume;
	dst->pan = src->pan;

	dst->volume_offset = src->volume_offset;
	dst->panning_offset = src->panning_offset;

	dst->note = src->note;

	dst->enabled_envelopes = src->enabled_envelopes;

	dst->filter_cutoff = src->filter_cutoff;
	dst->filter_resonance = src->filter_resonance;

	dst->true_filter_cutoff = src->true_filter_cutoff;
	dst->true_filter_resonance = src->true_filter_resonance;

	dst->vibrato_speed = src->vibrato_speed;
	dst->vibrato_depth = src->vibrato_depth;
	dst->vibrato_n = src->vibrato_n;
	dst->vibrato_time = src->vibrato_time;
	dst->vibrato_waveform = src->vibrato_waveform;

	dst->tremolo_speed = src->tremolo_speed;
	dst->tremolo_depth = src->tremolo_depth;
	dst->tremolo_time = src->tremolo_time;
	dst->tremolo_waveform = src->tremolo_waveform;

	dst->panbrello_speed = src->panbrello_speed;
	dst->panbrello_depth = src->panbrello_depth;
	dst->panbrello_time = src->panbrello_time;
	dst->panbrello_waveform = src->panbrello_waveform;
	dst->panbrello_random = src->panbrello_random;

	dst->sample_vibrato_time = src->sample_vibrato_time;
	dst->sample_vibrato_waveform = src->sample_vibrato_waveform;
	dst->sample_vibrato_depth = src->sample_vibrato_depth;

	dst->slide = src->slide;
	dst->delta = src->delta;
	dst->finetune = src->finetune;

	dst->volume_envelope = src->volume_envelope;
	dst->pan_envelope = src->pan_envelope;
	dst->pitch_envelope = src->pitch_envelope;

	dst->fadeoutcount = src->fadeoutcount;

	dst->filter_state[0] = src->filter_state[0];
	dst->filter_state[1] = src->filter_state[1];

	dst->resampler = src->resampler;
	dst->resampler.pickup_data = dst;
	dst->resampler.fir_resampler_ratio = src->resampler.fir_resampler_ratio;
	dst->resampler.fir_resampler[0] = resampler_dup( src->resampler.fir_resampler[0] );
	if ( !dst->resampler.fir_resampler[0] ) {
		free( dst );
		return NULL;
	}
	dst->resampler.fir_resampler[1] = resampler_dup( src->resampler.fir_resampler[1] );
	if ( !dst->resampler.fir_resampler[1] ) {
		resampler_delete( dst->resampler.fir_resampler[0] );
		free( dst );
		return NULL;
	}
	dst->time_lost = src->time_lost;

	//dst->output = src->output;

	return dst;
}